

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O0

void __thiscall TTD::FileWriter::WriteRawByteBuff_Fixed<char16_t>(FileWriter *this,char16_t *data)

{
  byte *dst;
  byte *trgt;
  char16_t *data_local;
  FileWriter *this_local;
  
  dst = ReserveSpaceForSmallData<2ul>(this);
  js_memcpy_s(dst,2,data,2);
  CommitSpaceForSmallData(this,2);
  return;
}

Assistant:

void WriteRawByteBuff_Fixed(const T& data)
        {
            byte* trgt = this->ReserveSpaceForSmallData<sizeof(T)>();

            js_memcpy_s(trgt, sizeof(T), (const byte*)(&data), sizeof(T));

            this->CommitSpaceForSmallData(sizeof(T));
        }